

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qcomparehelpers.h
# Opt level: O1

const_iterator __thiscall
QMap<unsigned_int,_unsigned_int>::find(QMap<unsigned_int,_unsigned_int> *this,uint *key)

{
  QMapData<std::map<unsigned_int,_unsigned_int,_std::less<unsigned_int>,_std::allocator<std::pair<const_unsigned_int,_unsigned_int>_>_>_>
  *pQVar1;
  const_iterator cVar2;
  const_iterator cVar3;
  _Base_ptr p_Var4;
  bool bVar5;
  
  pQVar1 = (this->d).d.ptr;
  if (pQVar1 == (QMapData<std::map<unsigned_int,_unsigned_int,_std::less<unsigned_int>,_std::allocator<std::pair<const_unsigned_int,_unsigned_int>_>_>_>
                 *)0x0) {
    cVar2._M_node = (_Base_ptr)0x0;
  }
  else {
    p_Var4 = *(_Base_ptr *)((long)&(pQVar1->m)._M_t._M_impl.super__Rb_tree_header._M_header + 8);
    cVar2._M_node = &(pQVar1->m)._M_t._M_impl.super__Rb_tree_header._M_header;
    cVar3._M_node = cVar2._M_node;
    if (p_Var4 != (_Base_ptr)0x0) {
      do {
        bVar5 = p_Var4[1]._M_color < *key;
        if (!bVar5) {
          cVar3._M_node = p_Var4;
        }
        p_Var4 = (&p_Var4->_M_left)[bVar5];
      } while (p_Var4 != (_Base_ptr)0x0);
    }
    if (cVar3._M_node != cVar2._M_node) {
      if (cVar3._M_node[1]._M_color <= *key) {
        cVar2._M_node = cVar3._M_node;
      }
      return (const_iterator)cVar2._M_node;
    }
  }
  return (const_iterator)cVar2._M_node;
}

Assistant:

constexpr P get() const noexcept { return ptr; }